

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O1

bool cmInstallCommandArguments::CheckPermissions(string *onePermission,string *permissions)

{
  int iVar1;
  char **ppcVar2;
  bool bVar3;
  
  bVar3 = PermissionsTable[0] != (char *)0x0;
  if (bVar3) {
    iVar1 = std::__cxx11::string::compare((char *)onePermission);
    if (iVar1 != 0) {
      ppcVar2 = PermissionsTable;
      do {
        ppcVar2 = ppcVar2 + 1;
        bVar3 = *ppcVar2 != (char *)0x0;
        if (*ppcVar2 == (char *)0x0) {
          return bVar3;
        }
        iVar1 = std::__cxx11::string::compare((char *)onePermission);
      } while (iVar1 != 0);
    }
    std::__cxx11::string::append((char *)permissions);
    std::__cxx11::string::_M_append((char *)permissions,(ulong)(onePermission->_M_dataplus)._M_p);
  }
  return bVar3;
}

Assistant:

bool cmInstallCommandArguments::CheckPermissions(
  const std::string& onePermission, std::string& permissions)
{
  // Check the permission against the table.
  for (const char** valid = cmInstallCommandArguments::PermissionsTable;
       *valid; ++valid) {
    if (onePermission == *valid) {
      // This is a valid permission.
      permissions += " ";
      permissions += onePermission;
      return true;
    }
  }
  // This is not a valid permission.
  return false;
}